

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall asmjit::_abi_1_10::CodeHolder::attach(CodeHolder *this,BaseEmitter *emitter)

{
  uint uVar1;
  Error EVar2;
  BaseEmitter *emitter_local;
  
  if (emitter == (BaseEmitter *)0x0) {
    EVar2 = 2;
  }
  else if ((byte)(emitter->_emitterType + ~kCompiler) < 0xfd) {
    EVar2 = 3;
  }
  else {
    uVar1._0_1_ = (this->_environment)._arch;
    uVar1._1_1_ = (this->_environment)._subArch;
    uVar1._2_1_ = (this->_environment)._vendor;
    uVar1._3_1_ = (this->_environment)._platform;
    if ((emitter->_archMask >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      EVar2 = 4;
    }
    else if (emitter->_code == (CodeHolder *)0x0) {
      emitter_local = emitter;
      EVar2 = ZoneVector<asmjit::_abi_1_10::BaseEmitter_*>::willGrow
                        (&this->_emitters,&this->_allocator,1);
      if ((EVar2 == 0) && (EVar2 = (*emitter->_vptr_BaseEmitter[0x10])(emitter,this), EVar2 == 0)) {
        if (emitter->_code != this) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/codeholder.cpp"
                     ,0xdd,"emitter->_code == this");
        }
        ZoneVector<asmjit::_abi_1_10::BaseEmitter_*>::appendUnsafe(&this->_emitters,&emitter_local);
        EVar2 = 0;
      }
    }
    else {
      EVar2 = (uint)(emitter->_code != this) * 3;
    }
  }
  return EVar2;
}

Assistant:

Error CodeHolder::attach(BaseEmitter* emitter) noexcept {
  // Catch a possible misuse of the API.
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  // Invalid emitter, this should not be possible.
  EmitterType type = emitter->emitterType();
  if (ASMJIT_UNLIKELY(type == EmitterType::kNone || uint32_t(type) > uint32_t(EmitterType::kMaxValue)))
    return DebugUtils::errored(kErrorInvalidState);

  uint64_t archMask = emitter->_archMask;
  if (ASMJIT_UNLIKELY(!(archMask & (uint64_t(1) << uint32_t(arch())))))
    return DebugUtils::errored(kErrorInvalidArch);

  // This is suspicious, but don't fail if `emitter` is already attached
  // to this code holder. This is not error, but it's not recommended.
  if (emitter->_code != nullptr) {
    if (emitter->_code == this)
      return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  // Reserve the space now as we cannot fail after `onAttach()` succeeded.
  ASMJIT_PROPAGATE(_emitters.willGrow(&_allocator, 1));
  ASMJIT_PROPAGATE(emitter->onAttach(this));

  // Connect CodeHolder <-> BaseEmitter.
  ASMJIT_ASSERT(emitter->_code == this);
  _emitters.appendUnsafe(emitter);

  return kErrorOk;
}